

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_format(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  lua_State *in_RDI;
  lua_Number lVar4;
  char *s;
  size_t l;
  char buff [512];
  char form [18];
  luaL_Buffer b;
  char *strfrmt_end;
  char *strfrmt;
  size_t sfl;
  int arg;
  int top;
  int in_stack_ffffffffffffdd2c;
  lua_State *in_stack_ffffffffffffdd30;
  char *in_stack_ffffffffffffdd38;
  luaL_Buffer *in_stack_ffffffffffffdd40;
  luaL_Buffer *in_stack_ffffffffffffdd48;
  lua_State *in_stack_ffffffffffffdd50;
  ulong local_2270;
  GCObject *in_stack_ffffffffffffdd98;
  int in_stack_ffffffffffffdda4;
  lua_State *in_stack_ffffffffffffdda8;
  undefined1 local_2068 [32];
  luaL_Buffer local_2048;
  undefined1 local_30 [16];
  long local_20;
  int local_18;
  int local_14;
  lua_State *local_10;
  
  local_10 = in_RDI;
  local_14 = lua_gettop(in_RDI);
  local_18 = 1;
  local_30._8_8_ =
       luaL_checklstring((lua_State *)in_stack_ffffffffffffdd40,
                         (int)((ulong)in_stack_ffffffffffffdd38 >> 0x20),
                         (size_t *)in_stack_ffffffffffffdd30);
  local_30._0_8_ = local_30._8_8_ + local_20;
  luaL_buffinit(local_10,&local_2048);
LAB_0011dc8f:
  while( true ) {
    while( true ) {
      if ((ulong)local_30._0_8_ <= (ulong)local_30._8_8_) {
        luaL_pushresult((luaL_Buffer *)0x11e0af);
        return 1;
      }
      if (*(char *)local_30._8_8_ == '%') break;
      if ((global_State *)local_30 <= local_2048.p) {
        luaL_prepbuffer((luaL_Buffer *)0x11dce8);
      }
      *(char *)&((stringtable *)local_2048.p)->hash = *(char *)local_30._8_8_;
      local_2048.p = (char *)((long)&((stringtable *)local_2048.p)->hash + 1);
      local_30._8_8_ = (char *)(local_30._8_8_ + 1);
    }
    pcVar3 = (char *)(local_30._8_8_ + 1);
    if (*(char *)(local_30._8_8_ + 1) != '%') break;
    local_30._8_8_ = pcVar3;
    if ((global_State *)local_30 <= local_2048.p) {
      luaL_prepbuffer((luaL_Buffer *)0x11dd81);
    }
    *(char *)&((stringtable *)local_2048.p)->hash = *(char *)local_30._8_8_;
    local_2048.p = (char *)((long)&((stringtable *)local_2048.p)->hash + 1);
    local_30._8_8_ = (char *)(local_30._8_8_ + 1);
  }
  local_18 = local_18 + 1;
  local_30._8_8_ = pcVar3;
  if (local_14 < local_18) {
    luaL_argerror(in_stack_ffffffffffffdda8,in_stack_ffffffffffffdda4,
                  (char *)in_stack_ffffffffffffdd98);
  }
  pcVar3 = scanformat((lua_State *)in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                      (char *)in_stack_ffffffffffffdd30);
  local_30._8_8_ = pcVar3 + 1;
  switch(*pcVar3) {
  case 'E':
  case 'G':
  case 'e':
  case 'f':
  case 'g':
    in_stack_ffffffffffffdd38 = &stack0xffffffffffffdd98;
    in_stack_ffffffffffffdd40 = (luaL_Buffer *)local_2068;
    luaL_checknumber(in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd2c);
    sprintf(in_stack_ffffffffffffdd38,(char *)in_stack_ffffffffffffdd40);
    break;
  default:
    iVar1 = luaL_error(local_10,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)*pcVar3);
    return iVar1;
  case 'X':
  case 'o':
  case 'u':
  case 'x':
    in_stack_ffffffffffffdd50 = (lua_State *)local_2068;
    addintlen((char *)in_stack_ffffffffffffdd30);
    in_stack_ffffffffffffdd48 = (luaL_Buffer *)&stack0xffffffffffffdd98;
    lVar4 = luaL_checknumber(in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd2c);
    sprintf((char *)in_stack_ffffffffffffdd48,(char *)in_stack_ffffffffffffdd50,
            (long)lVar4 | (long)(lVar4 - 9.223372036854776e+18) & (long)lVar4 >> 0x3f);
    break;
  case 'c':
    lVar4 = luaL_checknumber(in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd2c);
    sprintf(&stack0xffffffffffffdd98,local_2068,(ulong)(uint)(int)lVar4);
    break;
  case 'd':
  case 'i':
    addintlen((char *)in_stack_ffffffffffffdd30);
    lVar4 = luaL_checknumber(in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd2c);
    sprintf(&stack0xffffffffffffdd98,local_2068,(long)lVar4);
    break;
  case 'q':
    addquoted(in_stack_ffffffffffffdd50,in_stack_ffffffffffffdd48,
              (int)((ulong)in_stack_ffffffffffffdd40 >> 0x20));
    goto LAB_0011dc8f;
  case 's':
    pcVar3 = luaL_checklstring((lua_State *)in_stack_ffffffffffffdd40,
                               (int)((ulong)in_stack_ffffffffffffdd38 >> 0x20),
                               (size_t *)in_stack_ffffffffffffdd30);
    pcVar2 = strchr(local_2068,0x2e);
    if ((pcVar2 != (char *)0x0) || (local_2270 < 100)) {
      sprintf(&stack0xffffffffffffdd98,local_2068,pcVar3);
      break;
    }
    lua_pushvalue((lua_State *)in_stack_ffffffffffffdd40,
                  (int)((ulong)in_stack_ffffffffffffdd38 >> 0x20));
    luaL_addvalue(in_stack_ffffffffffffdd40);
    goto LAB_0011dc8f;
  }
  in_stack_ffffffffffffdd30 = (lua_State *)&stack0xffffffffffffdd98;
  strlen(&stack0xffffffffffffdd98);
  luaL_addlstring(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                  (size_t)in_stack_ffffffffffffdd30);
  goto LAB_0011dc8f;
}

Assistant:

static int str_format(lua_State*L){
int top=lua_gettop(L);
int arg=1;
size_t sfl;
const char*strfrmt=luaL_checklstring(L,arg,&sfl);
const char*strfrmt_end=strfrmt+sfl;
luaL_Buffer b;
luaL_buffinit(L,&b);
while(strfrmt<strfrmt_end){
if(*strfrmt!='%')
luaL_addchar(&b,*strfrmt++);
else if(*++strfrmt=='%')
luaL_addchar(&b,*strfrmt++);
else{
char form[(sizeof("-+ #0")+sizeof("l")+10)];
char buff[512];
if(++arg>top)
luaL_argerror(L,arg,"no value");
strfrmt=scanformat(L,strfrmt,form);
switch(*strfrmt++){
case'c':{
sprintf(buff,form,(int)luaL_checknumber(L,arg));
break;
}
case'd':case'i':{
addintlen(form);
sprintf(buff,form,(long)luaL_checknumber(L,arg));
break;
}
case'o':case'u':case'x':case'X':{
addintlen(form);
sprintf(buff,form,(unsigned long)luaL_checknumber(L,arg));
break;
}
case'e':case'E':case'f':
case'g':case'G':{
sprintf(buff,form,(double)luaL_checknumber(L,arg));
break;
}
case'q':{
addquoted(L,&b,arg);
continue;
}
case's':{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
if(!strchr(form,'.')&&l>=100){
lua_pushvalue(L,arg);
luaL_addvalue(&b);
continue;
}
else{
sprintf(buff,form,s);
break;
}
}
default:{
return luaL_error(L,"invalid option "LUA_QL("%%%c")" to "
LUA_QL("format"),*(strfrmt-1));
}
}
luaL_addlstring(&b,buff,strlen(buff));
}
}
luaL_pushresult(&b);
return 1;
}